

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_set_all_gej(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  secp256k1_ge *psVar4;
  secp256k1_fe *psVar5;
  long lVar6;
  bool bVar7;
  secp256k1_fe u;
  secp256k1_fe local_58;
  
  if (len != 0) {
    (r->x).n[4] = (a->z).n[4];
    uVar1 = (a->z).n[0];
    uVar2 = (a->z).n[1];
    uVar3 = (a->z).n[3];
    (r->x).n[2] = (a->z).n[2];
    (r->x).n[3] = uVar3;
    (r->x).n[0] = uVar1;
    (r->x).n[1] = uVar2;
    lVar6 = len - 1;
    psVar5 = &a[1].z;
    psVar4 = r;
    while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
      secp256k1_fe_impl_mul(&psVar4[1].x,&psVar4->x,psVar5);
      psVar5 = (secp256k1_fe *)((long)(psVar5 + 3) + 8);
      psVar4 = psVar4 + 1;
    }
    lVar6 = len - 1;
    secp256k1_fe_impl_inv(&local_58,&r[len - 1].x);
    psVar5 = &a[len - 1].z;
    psVar4 = r + (len - 2);
    while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
      secp256k1_fe_impl_mul(&psVar4[1].x,&psVar4->x,&local_58);
      secp256k1_fe_impl_mul(&local_58,&local_58,psVar5);
      psVar5 = (secp256k1_fe *)((long)(psVar5 + -4) + 0x20);
      psVar4 = psVar4 + -1;
    }
    (r->x).n[4] = local_58.n[4];
    (r->x).n[2] = local_58.n[2];
    (r->x).n[3] = local_58.n[3];
    (r->x).n[0] = local_58.n[0];
    (r->x).n[1] = local_58.n[1];
    while (bVar7 = len != 0, len = len - 1, bVar7) {
      secp256k1_ge_set_gej_zinv(r,a,&r->x);
      r = r + 1;
      a = a + 1;
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
        VERIFY_CHECK(!secp256k1_gej_is_infinity(&a[i]));
    }
#endif

    if (len == 0) {
        return;
    }

    /* Use destination's x coordinates as scratch space */
    r[0].x = a[0].z;
    for (i = 1; i < len; i++) {
        secp256k1_fe_mul(&r[i].x, &r[i - 1].x, &a[i].z);
    }
    secp256k1_fe_inv(&u, &r[len - 1].x);

    for (i = len - 1; i > 0; i--) {
        secp256k1_fe_mul(&r[i].x, &r[i - 1].x, &u);
        secp256k1_fe_mul(&u, &u, &a[i].z);
    }
    r[0].x = u;

    for (i = 0; i < len; i++) {
        secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}